

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxInReference_Constractor_Test::TestBody
          (ConfidentialTxInReference_Constractor_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_reference pvVar6;
  AssertHelper local_9b0;
  Message local_9a8;
  string local_9a0;
  string local_980;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_14;
  size_t idx_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_930;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_peg_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_908;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_8f0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_peg_vector;
  Message local_8e0;
  uint32_t local_8d8;
  uint32_t local_8d4;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_13;
  Message local_8b8;
  string local_8b0;
  string local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_12;
  size_t idx;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_840;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_818;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_800;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_vector;
  Message local_7f0;
  uint32_t local_7e8;
  uint32_t local_7e4;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_11;
  Message local_7c8;
  string local_7c0;
  ByteData local_7a0;
  string local_788;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_10;
  Message local_750;
  string local_748;
  ByteData local_728;
  string local_710;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_9;
  Message local_6d8;
  string local_6d0;
  ConfidentialValue local_6b0;
  string local_688;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_8;
  Message local_650;
  string local_648;
  ConfidentialValue local_628;
  string local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_7;
  Message local_5c8;
  string local_5c0;
  ByteData256 local_5a0;
  string local_588;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_6;
  Message local_550;
  string local_548;
  ByteData256 local_528;
  string local_510;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_5;
  Message local_4d8;
  string local_4d0;
  Script local_4b0;
  string local_478;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_4;
  Message local_440;
  string local_438;
  Txid local_418;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_3;
  Message local_3c0;
  uint32_t local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_2;
  Message local_398;
  uint32_t local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  ConfidentialTxInReference txinref;
  Message local_210;
  ByteData256 local_208;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  ConfidentialTxIn txin;
  undefined1 local_50 [8];
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ConfidentialTxInReference_Constractor_Test *this_local;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)&gtest_ar.message_,&exp_txid,2,0xfffffffe,&exp_script,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&exp_blinding_nonce,&exp_asset_entropy,
             &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
             &exp_inflation_keys_rangeproof,(ScriptWitness *)local_50);
  cfd::core::ConfidentialTxIn::GetWitnessHash(&local_208,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1f0,&local_208);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d0,"txin.GetWitnessHash().GetHex().c_str()",
             "\"c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c\"",pcVar3,
             "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  std::__cxx11::string::~string((string *)&local_1f0);
  cfd::core::ByteData256::~ByteData256(&local_208);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txinref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x158,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txinref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_210);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txinref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar_1.message_,
             (ConfidentialTxIn *)&gtest_ar.message_);
  local_38c = cfd::core::AbstractTxInReference::GetVout
                        ((AbstractTxInReference *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_388,"txinref.GetVout()","exp_index",&local_38c,&exp_index);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_3b4 = cfd::core::AbstractTxInReference::GetSequence
                        ((AbstractTxInReference *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_3b0,"txinref.GetSequence()","exp_sequence",&local_3b4,
             &exp_sequence);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  cfd::core::AbstractTxInReference::GetTxid
            (&local_418,(AbstractTxInReference *)&gtest_ar_1.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_3f8,&local_418);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_438,&exp_txid);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d8,"txinref.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3f8);
  cfd::core::Txid::~Txid(&local_418);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar2) {
    testing::Message::Message(&local_440);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  cfd::core::AbstractTxInReference::GetUnlockingScript
            (&local_4b0,(AbstractTxInReference *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_478,&local_4b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_4d0,&exp_script);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_458,"txinref.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_478);
  cfd::core::Script::~Script(&local_4b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar2) {
    testing::Message::Message(&local_4d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  cfd::core::ConfidentialTxInReference::GetBlindingNonce
            (&local_528,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_510,&local_528);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_548,&exp_blinding_nonce);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4f0,"txinref.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_510);
  cfd::core::ByteData256::~ByteData256(&local_528);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar2) {
    testing::Message::Message(&local_550);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  cfd::core::ConfidentialTxInReference::GetAssetEntropy
            (&local_5a0,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_588,&local_5a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5c0,&exp_asset_entropy);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_568,"txinref.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_588);
  cfd::core::ByteData256::~ByteData256(&local_5a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar2) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x163,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmount
            (&local_628,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_600,&local_628);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_648,&exp_issuance_amount);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5e0,"txinref.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_600);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_628);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_650);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x165,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  cfd::core::ConfidentialTxInReference::GetInflationKeys
            (&local_6b0,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_688,&local_6b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_6d0,&exp_inflation_keys);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_668,"txinref.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_688);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_6b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar2) {
    testing::Message::Message(&local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x167,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmountRangeproof
            (&local_728,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_710,&local_728);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_748,&exp_issuance_amount_rangeproof);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6f0,"txinref.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_710);
  cfd::core::ByteData::~ByteData(&local_728);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar2) {
    testing::Message::Message(&local_750);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x169,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_750);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  cfd::core::ConfidentialTxInReference::GetInflationKeysRangeproof
            (&local_7a0,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_788,&local_7a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_7c0,&exp_inflation_keys_rangeproof);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_768,"txinref.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_788);
  cfd::core::ByteData::~ByteData(&local_7a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  local_7e4 = cfd::core::AbstractTxInReference::GetScriptWitnessStackNum
                        ((AbstractTxInReference *)&gtest_ar_1.message_);
  local_7e8 = cfd::core::ScriptWitness::GetWitnessNum
                        ((ScriptWitness *)
                         &exp_pegin_witness.witness_stack_.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_7e0,"txinref.GetScriptWitnessStackNum()",
             "exp_witness_stack.GetWitnessNum()",&local_7e4,&local_7e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar2) {
    testing::Message::Message(&local_7f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x16d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_vector,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_vector);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  cfd::core::AbstractTxInReference::GetScriptWitness
            ((ScriptWitness *)&exp_vector,(AbstractTxInReference *)&gtest_ar_1.message_);
  cfd::core::ScriptWitness::GetWitness(&local_818,(ScriptWitness *)&exp_vector);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&exp_vector);
  local_800 = &local_818;
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_840 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx;
  for (gtest_ar_12.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_12.message_.ptr_,
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (local_800), sVar1.ptr_ < pbVar5;
      gtest_ar_12.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_12.message_.ptr_)->field_0x1) {
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_800,(size_type)gtest_ar_12.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_890,pvVar6);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_840,(size_type)gtest_ar_12.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_8b0,pvVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_870,"test_vector[idx].GetHex().c_str()",
               "exp_vector[idx].GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::~string((string *)&local_890);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
    if (!bVar2) {
      testing::Message::Message(&local_8b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x173,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_8b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_8b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  }
  local_8d4 = cfd::core::ConfidentialTxInReference::GetPeginWitnessStackNum
                        ((ConfidentialTxInReference *)&gtest_ar_1.message_);
  local_8d8 = cfd::core::ScriptWitness::GetWitnessNum((ScriptWitness *)local_50);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_8d0,"txinref.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum()",&local_8d4,&local_8d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar2) {
    testing::Message::Message(&local_8e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_peg_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x176,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_peg_vector,&local_8e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_peg_vector);
    testing::Message::~Message(&local_8e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  cfd::core::ConfidentialTxInReference::GetPeginWitness
            ((ScriptWitness *)&exp_peg_vector,(ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ScriptWitness::GetWitness(&local_908,(ScriptWitness *)&exp_peg_vector);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&exp_peg_vector);
  local_8f0 = &local_908;
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (ScriptWitness *)local_50);
  local_930 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1;
  for (gtest_ar_14.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_14.message_.ptr_,
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (local_8f0), sVar1.ptr_ < pbVar5;
      gtest_ar_14.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_14.message_.ptr_)->field_0x1) {
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_8f0,(size_type)gtest_ar_14.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_980,pvVar6);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_930,(size_type)gtest_ar_14.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_9a0,pvVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_960,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::__cxx11::string::~string((string *)&local_980);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
    if (!bVar2) {
      testing::Message::Message(&local_9a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_960);
      testing::internal::AssertHelper::AssertHelper
                (&local_9b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x17c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
      testing::internal::AssertHelper::~AssertHelper(&local_9b0);
      testing::Message::~Message(&local_9a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_908);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_818);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar_1.message_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_50);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, Constractor) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  
  ConfidentialTxInReference txinref(txin);
  EXPECT_EQ(txinref.GetVout(), exp_index);
  EXPECT_EQ(txinref.GetSequence(), exp_sequence);
  EXPECT_STREQ(txinref.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txinref.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txinref.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txinref.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txinref.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txinref.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txinref.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txinref.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_EQ(txinref.GetScriptWitnessStackNum(),
      exp_witness_stack.GetWitnessNum());
  const std::vector<ByteData>& test_vector = txinref.GetScriptWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_vector = exp_witness_stack.GetWitness();
  for (size_t idx = 0; idx < test_vector.size(); ++idx) {
    EXPECT_STREQ(test_vector[idx].GetHex().c_str(),
        exp_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(txinref.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum());
  const std::vector<ByteData>& test_peg_vector = txinref.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < test_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
}